

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cpp
# Opt level: O2

void __thiscall FFT_Multiplies_Test::TestBody(FFT_Multiplies_Test *this)

{
  pointer *this_00;
  int iVar1;
  char *message;
  ulong uVar2;
  undefined1 local_b0 [8];
  vector<long_long,_std::allocator<long_long>_> p1;
  vector<long_long,_std::allocator<long_long>_> want;
  AssertHelper local_68;
  ulong local_60;
  undefined1 local_58 [8];
  vector<long_long,_std::allocator<long_long>_> p2;
  AssertionResult gtest_ar;
  
  for (local_60 = 0; (int)local_60 != 0x1e; local_60 = (ulong)((int)local_60 + 1)) {
    iVar1 = rand();
    std::vector<long_long,_std::allocator<long_long>_>::vector
              ((vector<long_long,_std::allocator<long_long>_> *)local_b0,
               (ulong)(iVar1 % 0x1e + 0x1e),(allocator_type *)local_58);
    iVar1 = rand();
    std::vector<long_long,_std::allocator<long_long>_>::vector
              ((vector<long_long,_std::allocator<long_long>_> *)local_58,
               (ulong)(iVar1 % 0x1e + 0x1e),
               (allocator_type *)
               &p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    for (uVar2 = 0;
        uVar2 < (ulong)((long)p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                              super__Vector_impl_data._M_start - (long)local_b0 >> 3);
        uVar2 = uVar2 + 1) {
      iVar1 = rand();
      *(long *)((long)local_b0 + uVar2 * 8) = (long)(iVar1 % 20000000 + -10000000);
    }
    for (uVar2 = 0;
        uVar2 < (ulong)((long)p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                              super__Vector_impl_data._M_start - (long)local_58 >> 3);
        uVar2 = uVar2 + 1) {
      iVar1 = rand();
      *(long *)((long)local_58 + uVar2 * 8) = (long)(iVar1 % 20000000 + -10000000);
    }
    multiplyNaive((vector<long_long,_std::allocator<long_long>_> *)
                  &p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
                  (vector<long_long,_std::allocator<long_long>_> *)local_b0,
                  (vector<long_long,_std::allocator<long_long>_> *)local_58);
    this_00 = &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    multiplyPolynomials((vector<long_long,_std::allocator<long_long>_> *)this_00,
                        (vector<long_long,_std::allocator<long_long>_> *)local_b0,
                        (vector<long_long,_std::allocator<long_long>_> *)local_58);
    testing::internal::
    CmpHelperEQ<std::vector<long_long,std::allocator<long_long>>,std::vector<long_long,std::allocator<long_long>>>
              ((internal *)
               &p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"want","multiplyPolynomials(p1, p2)",
               (vector<long_long,_std::allocator<long_long>_> *)
               &p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<long_long,_std::allocator<long_long>_> *)this_00);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)this_00);
    if ((char)p2.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == '\0') {
      testing::Message::Message
                ((Message *)
                 &want.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      message = "";
      if (gtest_ar._0_8_ != 0) {
        message = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/numerical/fft_test.cpp"
                 ,0x36,message);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)
               &p1.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)local_58);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)local_b0);
  }
  return;
}

Assistant:

TEST(FFT, Multiplies) {
    rep(i, 0, 30) {
        vector<ll> p1(30 + rand() % 30), p2(30 + rand() % 30);
        rep(j, 0, p1.size()) p1[j] = rand() % 20000000 - 10000000;
        rep(j, 0, p2.size()) p2[j] = rand() % 20000000 - 10000000;
        vector<ll> want = multiplyNaive(p1, p2);
        EXPECT_EQ(want, multiplyPolynomials(p1, p2));
    }
}